

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void ly_vlog_str(ly_ctx *ctx,LY_VLOG_ELEM elem_type,char *str,...)

{
  char in_AL;
  ly_err_item *plVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (elem_type != LY_VLOG_NONE) {
    if (elem_type != LY_VLOG_PREV) {
      __assert_fail("(elem_type == LY_VLOG_NONE) || (elem_type == LY_VLOG_PREV)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                    ,0x382,
                    "void ly_vlog_str(const struct ly_ctx *, enum LY_VLOG_ELEM, const char *, ...)")
      ;
    }
    plVar1 = ly_err_first(ctx);
    if ((plVar1 != (ly_err_item *)0x0) && (pcVar2 = plVar1->prev->path, pcVar2 != (char *)0x0)) {
      pcVar2 = strdup(pcVar2);
      goto LAB_0010fcb4;
    }
  }
  pcVar2 = (char *)0x0;
LAB_0010fcb4:
  pcVar3 = strchr(str,0x25);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strdup(str);
  }
  else {
    sVar4 = strlen(str);
    pcVar3 = (char *)malloc(sVar4 * 2 + 1);
    strcpy(pcVar3,str);
    for (__s = strchr(pcVar3,0x25); __s != (char *)0x0; __s = strchr(__s + 2,0x25)) {
      sVar4 = strlen(__s);
      memmove(__s + 1,__s,sVar4 + 1);
      *__s = '%';
    }
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_48._0_4_ = 0x18;
  local_48._4_4_ = 0x30;
  log_vprintf(ctx,LY_LLERR,LY_EVALID,LYVE_SUCCESS,pcVar2,pcVar3,(__va_list_tag *)local_48);
  free(pcVar3);
  return;
}

Assistant:

void
ly_vlog_str(const struct ly_ctx *ctx, enum LY_VLOG_ELEM elem_type, const char *str, ...)
{
    va_list ap;
    char *path = NULL, *fmt, *ptr;
    const struct ly_err_item *first;

    assert((elem_type == LY_VLOG_NONE) || (elem_type == LY_VLOG_PREV));

    if (elem_type == LY_VLOG_PREV) {
        /* use previous path */
        first = ly_err_first(ctx);
        if (first && first->prev->path) {
            path = strdup(first->prev->path);
        }
    }

    if (strchr(str, '%')) {
        /* must be enough */
        fmt = malloc(2 * strlen(str) + 1);
        strcpy(fmt, str);
        for (ptr = strchr(fmt, '%'); ptr; ptr = strchr(ptr + 2, '%')) {
            memmove(ptr + 1, ptr, strlen(ptr) + 1);
            ptr[0] = '%';
        }
    } else {
        fmt = strdup(str);
    }

    va_start(ap, str);
    /* path is spent and should not be freed! */
    log_vprintf(ctx, LY_LLERR, LY_EVALID, LYVE_SUCCESS, path, fmt, ap);
    va_end(ap);

    free(fmt);
}